

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::addWarning(ConfigData *config,string *_warning)

{
  int iVar1;
  runtime_error *this;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  iVar1 = std::__cxx11::string::compare((char *)_warning);
  if (iVar1 == 0) {
    *(undefined1 *)&config->warnings = (char)config->warnings | NoAssertions;
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_68,"Unrecognised warning: \'",_warning);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_48 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_48 == plVar3) {
    local_38 = *plVar3;
    lStack_30 = plVar2[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar3;
  }
  local_40 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_48);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void addWarning( ConfigData& config, std::string const& _warning ) {
        if( _warning == "NoAssertions" )
            config.warnings = static_cast<WarnAbout::What>( config.warnings | WarnAbout::NoAssertions );
        else
            throw std::runtime_error( "Unrecognised warning: '" + _warning + "'" );
    }